

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCADeserialization.cpp
# Opt level: O3

char16 * __thiscall
Js::DeserializationCloner<Js::StreamReader>::TryReadString
          (DeserializationCloner<Js::StreamReader> *this,charcount_t *len,bool reuseBuffer)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  Recycler *pRVar5;
  char16 *pv;
  uint uVar6;
  undefined1 local_68 [8];
  TrackAllocData data;
  uint32 byteLen;
  ulong uVar7;
  
  bVar2 = ThreadContext::IsOnStack(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/SCACore/SCADeserialization.cpp"
                                ,0x1b1,"(ThreadContext::IsOnStack(this))",
                                "ThreadContext::IsOnStack(this)");
    if (!bVar2) goto LAB_00f08a13;
    *puVar4 = 0;
  }
  StreamReader::Read<unsigned_int>(this->m_reader,(uint *)&data.field_0x24);
  if (data._36_4_ == -1) {
    pv = (char16 *)0x0;
  }
  else {
    if (data._36_4_ == 0) {
      *len = 0;
      return L"";
    }
    uVar6 = (uint)data._36_4_ >> 1;
    uVar7 = (ulong)uVar6;
    if (reuseBuffer) {
      if (this->m_bufferLength < uVar6) {
        data.plusSize = uVar7 + 1;
        local_68 = (undefined1  [8])&char16_t::typeinfo;
        data.typeinfo = (type_info *)0x0;
        data.count = (size_t)anon_var_dwarf_ac963f4;
        data.filename._0_4_ = 0x1c9;
        pRVar5 = Memory::Recycler::TrackAllocInfo
                           (((this->
                             super_ClonerBase<unsigned_int,_void_*,_SCATypeId,_Js::DeserializationCloner<Js::StreamReader>_>
                             ).super_ScriptContextHolder.m_scriptContext)->recycler,
                            (TrackAllocData *)local_68);
        BVar3 = ExceptionCheck::CanHandleOutOfMemory();
        if (BVar3 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar4 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                      ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                      "ExceptionCheck::CanHandleOutOfMemory()");
          if (!bVar2) goto LAB_00f08a13;
          *puVar4 = 0;
        }
        pv = (char16 *)
             Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                       (pRVar5,uVar7 * 2 + 2);
        if (pv == (char16 *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar4 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                      ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
          if (!bVar2) goto LAB_00f08a13;
          *puVar4 = 0;
        }
        this->m_buffer = pv;
        this->m_bufferLength = uVar6;
      }
      else {
        pv = this->m_buffer;
      }
    }
    else {
      data.plusSize = uVar7 + 1;
      local_68 = (undefined1  [8])&char16_t::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.count = (size_t)anon_var_dwarf_ac963f4;
      data.filename._0_4_ = 0x1d2;
      pRVar5 = Memory::Recycler::TrackAllocInfo
                         (((this->
                           super_ClonerBase<unsigned_int,_void_*,_SCATypeId,_Js::DeserializationCloner<Js::StreamReader>_>
                           ).super_ScriptContextHolder.m_scriptContext)->recycler,
                          (TrackAllocData *)local_68);
      BVar3 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar3 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                    "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar2) goto LAB_00f08a13;
        *puVar4 = 0;
      }
      pv = (char16 *)
           Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                     (pRVar5,uVar7 * 2 + 2);
      if (pv == (char16 *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar2) {
LAB_00f08a13:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
    }
    StreamReader::Read(this->m_reader,pv,(ulong)(uint)data._36_4_);
    pv[uVar7] = L'\0';
    *len = uVar6;
    if ((data._36_4_ & 3) != 0) {
      StreamReader::Read(this->m_reader,local_68,4 - ((ulong)(uint)data._36_4_ & 3));
    }
  }
  return pv;
}

Assistant:

const char16* DeserializationCloner<Reader>::TryReadString(charcount_t* len, bool reuseBuffer) const
    {
        // m_buffer is allocated on GC heap and stored in a regular field.
        // that is ok since 'this' is always a stack instance.
        Assert(ThreadContext::IsOnStack(this));

        uint32 byteLen;
        m_reader->Read(&byteLen);

        if (byteLen == SCA_PROPERTY_TERMINATOR)
        {
            return nullptr;
        }
        else if (byteLen == 0)
        {
            *len = 0;
            return _u("");
        }
        else
        {
            charcount_t newLen = byteLen / sizeof(char16);
            char16* buf;

            if (reuseBuffer)
            {
                if (this->m_bufferLength < newLen)
                {
                    Recycler* recycler = this->GetScriptContext()->GetRecycler();
                    this->m_buffer = RecyclerNewArrayLeaf(recycler, char16, newLen + 1);
                    this->m_bufferLength = newLen;
                }

                buf = this->m_buffer;
            }
            else
            {
                Recycler* recycler = this->GetScriptContext()->GetRecycler();
                buf = RecyclerNewArrayLeaf(recycler, char16, newLen + 1);
            }

            m_reader->Read(buf, byteLen);
            buf[newLen] = NULL;
            *len = newLen;

            uint32 unalignedLen = byteLen % sizeof(uint32);
            if (unalignedLen)
            {
                uint32 padding;
                m_reader->Read(&padding, sizeof(uint32) - unalignedLen);
            }

            return buf;
        }
    }